

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

int64_t eval2(C_Parser *parser,C_Node *node,char ***label)

{
  char cVar1;
  int iVar2;
  C_Type *pCVar3;
  _Bool _Var4;
  uint uVar5;
  long lVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  uint uVar10;
  char *fmt;
  long lVar11;
  C_Token *tok;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  
  C_add_type(parser,node);
  _Var4 = C_is_flonum(node->ty);
  lVar11 = 0;
  if (_Var4) {
LAB_00126a77:
    dVar14 = eval_double(parser,node);
    uVar12 = (ulong)dVar14;
LAB_00126a87:
    return lVar11 + uVar12;
  }
LAB_00126aa3:
  switch(node->kind) {
  case ND_ADD:
    iVar7 = eval2(parser,node->lhs,label);
    node = node->rhs;
    lVar11 = lVar11 + iVar7;
    C_add_type(parser,node);
    _Var4 = C_is_flonum(node->ty);
    label = (char ***)0x0;
    goto LAB_00126af8;
  case ND_SUB:
    iVar7 = eval2(parser,node->lhs,label);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    return (iVar7 + lVar11) - iVar8;
  case ND_MUL:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = iVar8 * iVar7;
    break;
  case ND_DIV:
    _Var4 = node->ty->is_unsigned;
    uVar12 = eval2(parser,node->lhs,(char ***)0x0);
    uVar9 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      uVar12 = uVar12 / uVar9;
    }
    else {
      uVar12 = (long)uVar12 / (long)uVar9;
    }
    break;
  case ND_NEG:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    return lVar11 - iVar7;
  case ND_MOD:
    _Var4 = node->ty->is_unsigned;
    uVar12 = eval2(parser,node->lhs,(char ***)0x0);
    uVar9 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      uVar12 = uVar12 % uVar9;
    }
    else {
      uVar12 = (long)uVar12 % (long)uVar9;
    }
    return lVar11 + uVar12;
  case ND_BITAND:
    uVar9 = eval2(parser,node->lhs,(char ***)0x0);
    uVar12 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = uVar12 & uVar9;
    break;
  case ND_BITOR:
    uVar9 = eval2(parser,node->lhs,(char ***)0x0);
    uVar12 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = uVar12 | uVar9;
    break;
  case ND_BITXOR:
    uVar9 = eval2(parser,node->lhs,(char ***)0x0);
    uVar12 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = uVar12 ^ uVar9;
    break;
  case ND_SHL:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = iVar7 << ((byte)iVar8 & 0x3f);
    goto LAB_00126a87;
  case ND_SHR:
    if ((node->ty->is_unsigned == true) && (node->ty->size == 8)) {
      uVar12 = eval2(parser,node->lhs,(char ***)0x0);
      iVar7 = eval2(parser,node->rhs,(char ***)0x0);
      uVar12 = uVar12 >> ((byte)iVar7 & 0x3f);
    }
    else {
      iVar7 = eval2(parser,node->lhs,(char ***)0x0);
      iVar8 = eval2(parser,node->rhs,(char ***)0x0);
      uVar12 = iVar7 >> ((byte)iVar8 & 0x3f);
    }
    goto LAB_00126a87;
  case ND_EQ:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = (ulong)(iVar7 == iVar8);
    goto LAB_00126f86;
  case ND_NE:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    iVar8 = eval2(parser,node->rhs,(char ***)0x0);
    uVar12 = (ulong)(iVar7 != iVar8);
    goto LAB_00126f86;
  case ND_LT:
    _Var4 = node->lhs->ty->is_unsigned;
    uVar12 = eval2(parser,node->lhs,(char ***)0x0);
    uVar9 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 == true) {
      bVar13 = uVar12 < uVar9;
      goto LAB_00126e76;
    }
    uVar12 = (ulong)((long)uVar12 < (long)uVar9);
LAB_00126f86:
    return lVar11 + uVar12;
  case ND_LE:
    _Var4 = node->lhs->ty->is_unsigned;
    uVar12 = eval2(parser,node->lhs,(char ***)0x0);
    uVar9 = eval2(parser,node->rhs,(char ***)0x0);
    if (_Var4 != true) {
      uVar12 = (ulong)((long)uVar12 <= (long)uVar9);
      goto LAB_00126f86;
    }
    bVar13 = uVar9 < uVar12;
    goto LAB_00126eec;
  default:
    goto switchD_00126ab9_caseD_10;
  case ND_COND:
    iVar7 = eval2(parser,node->cond,(char ***)0x0);
    lVar6 = (ulong)(iVar7 == 0) * 8 + 0x38;
    goto LAB_00126ae0;
  case ND_COMMA:
    lVar6 = 0x28;
LAB_00126ae0:
    node = *(C_Node **)((long)&node->kind + lVar6);
    C_add_type(parser,node);
    _Var4 = C_is_flonum(node->ty);
LAB_00126af8:
    if (_Var4 != false) goto LAB_00126a77;
    goto LAB_00126aa3;
  case ND_MEMBER:
    if (label == (char ***)0x0) goto switchD_00126ab9_caseD_10;
    if (node->ty->kind != TY_ARRAY) {
LAB_00126fce:
      tok = node->tok;
      fmt = "invalid initializer";
      goto LAB_00126fc4;
    }
    iVar7 = eval_rval(parser,node->lhs,label);
    uVar12 = node->member->offset + iVar7;
    goto LAB_00126a87;
  case ND_ADDR:
    uVar12 = eval_rval(parser,node->lhs,label);
    goto LAB_00126a87;
  case ND_NOT:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    bVar13 = iVar7 == 0;
LAB_00126e76:
    return lVar11 + (ulong)bVar13;
  case ND_BITNOT:
    uVar12 = eval2(parser,node->lhs,(char ***)0x0);
    uVar12 = ~uVar12;
    break;
  case ND_LOGAND:
    uVar12 = 0;
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    if (iVar7 != 0) goto LAB_00126eda;
    goto LAB_00126a87;
  case ND_LOGOR:
    iVar7 = eval2(parser,node->lhs,(char ***)0x0);
    uVar12 = 1;
    if (iVar7 == 0) {
LAB_00126eda:
      iVar7 = eval2(parser,node->rhs,(char ***)0x0);
      bVar13 = iVar7 == 0;
LAB_00126eec:
      return (lVar11 + 1) - (ulong)bVar13;
    }
    goto LAB_00126a87;
  case ND_LABEL_VAL:
    *label = &node->unique_label;
LAB_00126f1f:
    uVar12 = 0;
    goto LAB_00126a87;
  case ND_VAR:
    if (label != (char ***)0x0) {
      if (1 < node->var->ty->kind - TY_FUNC) goto LAB_00126fce;
      *label = &node->var->name;
      goto LAB_00126f1f;
    }
switchD_00126ab9_caseD_10:
    tok = node->tok;
    fmt = "not a compile-time constant";
LAB_00126fc4:
    C_error_tok(parser,tok,fmt);
  case ND_NUM:
    uVar12 = node->val;
    goto LAB_00126a87;
  case ND_CAST:
    uVar12 = eval2(parser,node->lhs,label);
    _Var4 = C_is_integer(node->ty);
    if (!_Var4) goto LAB_00126a87;
    pCVar3 = node->ty;
    iVar2 = pCVar3->size;
    if (iVar2 == 4) {
      uVar12 = uVar12 & 0xffffffff;
      goto LAB_00126a87;
    }
    if (iVar2 == 2) {
      uVar10 = (uint)uVar12 & 0xffff;
      cVar1 = pCVar3->is_unsigned;
      uVar5 = (uint)(short)uVar12;
    }
    else {
      if (iVar2 != 1) goto LAB_00126a87;
      uVar10 = (uint)uVar12 & 0xff;
      cVar1 = pCVar3->is_unsigned;
      uVar5 = (uint)(char)uVar12;
    }
    if (cVar1 != '\0') {
      uVar5 = uVar10;
    }
    uVar12 = (ulong)(int)uVar5;
    goto LAB_00126a87;
  }
  return lVar11 + uVar12;
}

Assistant:

static int64_t eval2(C_Parser *parser, C_Node *node, char ***label) {
  C_add_type(parser, node);

  if (C_is_flonum(node->ty))
    return eval_double(parser, node);

  switch (node->kind) {
  case ND_ADD:
    return eval2(parser, node->lhs, label) + eval(parser, node->rhs);
  case ND_SUB:
    return eval2(parser, node->lhs, label) - eval(parser, node->rhs);
  case ND_MUL:
    return eval(parser, node->lhs) * eval(parser, node->rhs);
  case ND_DIV:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) / eval(parser, node->rhs);
    return eval(parser, node->lhs) / eval(parser, node->rhs);
  case ND_NEG:
    return -eval(parser, node->lhs);
  case ND_MOD:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) % eval(parser, node->rhs);
    return eval(parser, node->lhs) % eval(parser, node->rhs);
  case ND_BITAND:
    return eval(parser, node->lhs) & eval(parser, node->rhs);
  case ND_BITOR:
    return eval(parser, node->lhs) | eval(parser, node->rhs);
  case ND_BITXOR:
    return eval(parser, node->lhs) ^ eval(parser, node->rhs);
  case ND_SHL:
    return eval(parser, node->lhs) << eval(parser, node->rhs);
  case ND_SHR:
    if (node->ty->is_unsigned && node->ty->size == 8)
      return (uint64_t)eval(parser, node->lhs) >> eval(parser, node->rhs);
    return eval(parser, node->lhs) >> eval(parser, node->rhs);
  case ND_EQ:
    return eval(parser, node->lhs) == eval(parser, node->rhs);
  case ND_NE:
    return eval(parser, node->lhs) != eval(parser, node->rhs);
  case ND_LT:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) < eval(parser, node->rhs);
    return eval(parser, node->lhs) < eval(parser, node->rhs);
  case ND_LE:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) <= eval(parser, node->rhs);
    return eval(parser, node->lhs) <= eval(parser, node->rhs);
  case ND_COND:
    return eval(parser, node->cond) ? eval2(parser, node->then, label) : eval2(parser, node->els, label);
  case ND_COMMA:
    return eval2(parser, node->rhs, label);
  case ND_NOT:
    return !eval(parser, node->lhs);
  case ND_BITNOT:
    return ~eval(parser, node->lhs);
  case ND_LOGAND:
    return eval(parser, node->lhs) && eval(parser, node->rhs);
  case ND_LOGOR:
    return eval(parser, node->lhs) || eval(parser, node->rhs);
  case ND_CAST: {
    int64_t val = eval2(parser, node->lhs, label);
    if (C_is_integer(node->ty)) {
      switch (node->ty->size) {
      case 1: return node->ty->is_unsigned ? (uint8_t)val : (int8_t)val;
      case 2: return node->ty->is_unsigned ? (uint16_t)val : (int16_t)val;
      case 4: return node->ty->is_unsigned ? (uint32_t)val : (int32_t)val;
      }
    }
    return val;
  }
  case ND_ADDR:
    return eval_rval(parser, node->lhs, label);
  case ND_LABEL_VAL:
    *label = &node->unique_label;
    return 0;
  case ND_MEMBER:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->ty->kind != TY_ARRAY)
      C_error_tok(parser, node->tok, "invalid initializer");
    return eval_rval(parser, node->lhs, label) + node->member->offset;
  case ND_VAR:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->var->ty->kind != TY_ARRAY && node->var->ty->kind != TY_FUNC)
      C_error_tok(parser, node->tok, "invalid initializer");
    *label = &node->var->name;
    return 0;
  case ND_NUM:
    return node->val;
  default:
    break;
  }

  C_error_tok(parser, node->tok, "not a compile-time constant");
  return 0; // not reached
}